

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O2

QAction * __thiscall QMenuBarPrivate::getNextAction(QMenuBarPrivate *this,int _start,int increment)

{
  QWidget *this_00;
  QAction *pQVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  QStyle *pQVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  lVar7 = (long)increment;
  do {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    updateGeometries(this);
    pQVar6 = QWidget::style(this_00);
    iVar4 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0xe,0,this_00,0);
    uVar5 = _start;
    if ((_start & increment) == 0xffffffff) {
      uVar5 = (uint)(this->super_QWidgetPrivate).actions.d.size;
    }
    if (increment == -1) {
      lVar10 = 0;
    }
    else {
      lVar10 = (long)((int)(this->super_QWidgetPrivate).actions.d.size + -1);
    }
    lVar8 = (long)(int)uVar5;
    lVar9 = (lVar7 + lVar8) * 0x10;
    for (; lVar10 != lVar8; lVar8 = lVar8 + lVar7) {
      pQVar1 = (this->super_QWidgetPrivate).actions.d.ptr[lVar7 + lVar8];
      bVar2 = QRect::isNull((QRect *)((long)&(((this->actionRects).d.ptr)->x1).m_i + lVar9));
      if (!bVar2) {
        if (iVar4 != 0) {
          return pQVar1;
        }
        cVar3 = QAction::isEnabled();
        if (cVar3 != '\0') {
          return pQVar1;
        }
      }
      lVar9 = lVar9 + lVar7 * 0x10;
    }
    bVar2 = _start == 0xffffffff;
    _start = 0xffffffff;
    if (bVar2) {
      return (QAction *)0x0;
    }
  } while( true );
}

Assistant:

QAction *QMenuBarPrivate::getNextAction(const int _start, const int increment) const
{
    Q_Q(const QMenuBar);
    const_cast<QMenuBarPrivate*>(this)->updateGeometries();
    bool allowActiveAndDisabled = q->style()->styleHint(QStyle::SH_Menu_AllowActiveAndDisabled, nullptr, q);
    const int start = (_start == -1 && increment == -1) ? actions.size() : _start;
    const int end =  increment == -1 ? 0 : actions.size() - 1;

    for (int i = start; i != end;) {
        i += increment;
        QAction *current = actions.at(i);
        if (!actionRects.at(i).isNull() && (allowActiveAndDisabled || current->isEnabled()))
            return current;
    }

    if (_start != -1) //let's try from the beginning or the end
        return getNextAction(-1, increment);

    return nullptr;
}